

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int)>::
ClearDefaultActionsLocked(FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int)> *this)

{
  OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int)> *this_00;
  bool bVar1;
  reference ppvVar2;
  __normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_50;
  __normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_48;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_40;
  const_iterator it;
  undefined1 local_28 [8];
  UntypedOnCallSpecs specs_to_delete;
  FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int)> *this_local;
  
  specs_to_delete.super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::vector
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)local_28);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::swap
            (&(this->super_UntypedFunctionMockerBase).untyped_on_call_specs_,
             (vector<const_void_*,_std::allocator<const_void_*>_> *)local_28);
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  local_48._M_current =
       (void **)std::vector<const_void_*,_std::allocator<const_void_*>_>::begin
                          ((vector<const_void_*,_std::allocator<const_void_*>_> *)local_28);
  __gnu_cxx::
  __normal_iterator<void_const*const*,std::vector<void_const*,std::allocator<void_const*>>>::
  __normal_iterator<void_const**>
            ((__normal_iterator<void_const*const*,std::vector<void_const*,std::allocator<void_const*>>>
              *)&local_40,&local_48);
  while( true ) {
    local_50._M_current =
         (void **)std::vector<const_void_*,_std::allocator<const_void_*>_>::end
                            ((vector<const_void_*,_std::allocator<const_void_*>_> *)local_28);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              ::operator*(&local_40);
    this_00 = (OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int)> *)*ppvVar2;
    if (this_00 != (OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int)> *)0x0) {
      OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int)>::~OnCallSpec(this_00);
      operator_delete(this_00,0x108);
    }
    __gnu_cxx::
    __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
    ::operator++(&local_40);
  }
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::~vector
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)local_28);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // Deleting our default actions may trigger other mock objects to be
    // deleted, for example if an action contains a reference counted smart
    // pointer to that mock object, and that is the last reference. So if we
    // delete our actions within the context of the global mutex we may deadlock
    // when this method is called again. Instead, make a copy of the set of
    // actions to delete, clear our set within the mutex, and then delete the
    // actions outside of the mutex.
    UntypedOnCallSpecs specs_to_delete;
    untyped_on_call_specs_.swap(specs_to_delete);

    g_gmock_mutex.Unlock();
    for (UntypedOnCallSpecs::const_iterator it =
             specs_to_delete.begin();
         it != specs_to_delete.end(); ++it) {
      delete static_cast<const OnCallSpec<F>*>(*it);
    }

    // Lock the mutex again, since the caller expects it to be locked when we
    // return.
    g_gmock_mutex.Lock();
  }